

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathfinderDVL.h
# Opt level: O1

int SetUpDownOrientationPathfinderDVL(PATHFINDERDVL *pPathfinderDVL,BOOL bUpOrientation)

{
  int iVar1;
  FILE *__s;
  uint uVar2;
  size_t sVar3;
  ssize_t sVar4;
  uint uVar5;
  ulong uVar6;
  char buf [32];
  char local_48 [40];
  
  sprintf(local_48,"EU%d\r",(ulong)(bUpOrientation != 0));
  sVar3 = strlen(local_48);
  iVar1 = (pPathfinderDVL->RS232Port).DevType;
  uVar2 = (uint)sVar3;
  if (iVar1 - 1U < 4) {
    if (0 < (int)uVar2) {
      iVar1 = (pPathfinderDVL->RS232Port).s;
      uVar6 = 0;
      do {
        sVar4 = send(iVar1,local_48 + uVar6,(long)(int)(uVar2 - (int)uVar6),0);
        if ((int)sVar4 < 1) goto LAB_001b1153;
        uVar5 = (int)uVar6 + (int)sVar4;
        uVar6 = (ulong)uVar5;
      } while ((int)uVar5 < (int)uVar2);
    }
  }
  else {
    if (iVar1 != 0) {
LAB_001b1153:
      puts("Error writing data to a PathfinderDVL. ");
      return 1;
    }
    if (uVar2 != 0) {
      iVar1 = *(int *)&(pPathfinderDVL->RS232Port).hDev;
      uVar6 = 0;
      do {
        sVar4 = write(iVar1,local_48 + uVar6,(ulong)(uVar2 - (int)uVar6));
        if ((int)sVar4 < 1) goto LAB_001b1153;
        uVar5 = (int)uVar6 + (int)sVar4;
        uVar6 = (ulong)uVar5;
      } while (uVar5 < uVar2);
    }
  }
  if ((pPathfinderDVL->bSaveRawData != 0) &&
     (__s = (FILE *)pPathfinderDVL->pfSaveFile, __s != (FILE *)0x0)) {
    sVar3 = strlen(local_48);
    fwrite(local_48,sVar3,1,__s);
    fflush((FILE *)pPathfinderDVL->pfSaveFile);
  }
  return 0;
}

Assistant:

inline int SetUpDownOrientationPathfinderDVL(PATHFINDERDVL* pPathfinderDVL, BOOL bUpOrientation)
{
	char buf[MAX_NB_BYTES_COMMAND_PATHFINDERDVL];

	sprintf(buf, "EU%d\r", bUpOrientation? 1: 0);

	if (WriteAllRS232Port(&pPathfinderDVL->RS232Port, (uint8*)buf, (int)strlen(buf)) != EXIT_SUCCESS)
	{
		printf("Error writing data to a PathfinderDVL. \n");
		return EXIT_FAILURE;
	}
	if ((pPathfinderDVL->bSaveRawData)&&(pPathfinderDVL->pfSaveFile))
	{
		fwrite(buf, strlen(buf), 1, pPathfinderDVL->pfSaveFile);
		fflush(pPathfinderDVL->pfSaveFile);
	}

	return EXIT_SUCCESS;
}